

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

void __thiscall
MinVR::VRSpecificItemFactory<MinVR::VRInputDevice>::~VRSpecificItemFactory
          (VRSpecificItemFactory<MinVR::VRInputDevice> *this)

{
  (this->super_VRItemFactory)._vptr_VRItemFactory =
       (_func_int **)&PTR__VRSpecificItemFactory_0015c770;
  std::__cxx11::string::~string((string *)&this->_typeName);
  return;
}

Assistant:

virtual ~VRSpecificItemFactory() {}